

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O0

ReadStatus __thiscall
PartiallyDownloadedBlock::FillBlock
          (PartiallyDownloadedBlock *this,CBlock *block,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx_missing)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  BlockValidationResult BVar2;
  size_t sVar3;
  char *pcVar4;
  size_type sVar5;
  reference psVar6;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range2;
  size_t i;
  size_t tx_missing_offset;
  const_iterator __end2;
  const_iterator __begin2;
  CheckBlockFn check_block;
  BlockValidationState state;
  uint256 hash;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  char *in_stack_fffffffffffffd20;
  CBlock *in_stack_fffffffffffffd28;
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
  *in_stack_fffffffffffffd30;
  Params *in_stack_fffffffffffffd38;
  CBlockHeader *in_stack_fffffffffffffd40;
  CBlock *in_stack_fffffffffffffd48;
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
  *in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  Params *in_stack_fffffffffffffd80;
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
  *in_stack_fffffffffffffd88;
  ConstevalFormatString<2U> fmt;
  size_t in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char *local_1f0;
  ulong local_1e8;
  ReadStatus local_1c4;
  undefined4 in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  unsigned_long *in_stack_fffffffffffffee0;
  unsigned_long *in_stack_fffffffffffffee8;
  unsigned_long *in_stack_fffffffffffffef0;
  CBlock local_108 [2];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CBlockHeader::IsNull
                    ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  if (bVar1) {
    local_1c4 = READ_STATUS_INVALID;
  }
  else {
    CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffffd38);
    CBlock::CBlock(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    CBlock::operator=(in_stack_fffffffffffffd28,(CBlock *)in_stack_fffffffffffffd20);
    CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    sVar3 = in_RSI + 0x50;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffffd38,(size_type)in_stack_fffffffffffffd30);
    local_1e8 = 0;
    local_1f0 = (char *)0x0;
    while (fmt.fmt = local_1f0,
          pcVar4 = (char *)std::
                           vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)),
          fmt.fmt < pcVar4) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      if (bVar1) {
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
        std::shared_ptr<const_CTransaction>::operator=
                  ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd28,
                   (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd20);
      }
      else {
        sVar5 = std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        if (sVar5 <= local_1e8) {
          local_1c4 = READ_STATUS_INVALID;
          goto LAB_008b9822;
        }
        local_1e8 = local_1e8 + 1;
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20);
        std::shared_ptr<const_CTransaction>::operator=
                  ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd28,
                   (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd20);
      }
      local_1f0 = local_1f0 + 1;
    }
    CBlockHeader::SetNull
              ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    sVar5 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    if (sVar5 == local_1e8) {
      BlockValidationState::BlockValidationState
                ((BlockValidationState *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      bVar1 = std::function::operator_cast_to_bool
                        ((function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                          *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      if (bVar1) {
        std::
        function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
        ::function((function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                    *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      }
      else {
        std::function<bool(CBlock_const&,BlockValidationState&,Consensus::Params_const&,bool,bool)>
        ::
        function<bool(&)(CBlock_const&,BlockValidationState&,Consensus::Params_const&,bool,bool),void>
                  ((function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                    *)in_stack_fffffffffffffd28,
                   (_func_bool_CBlock_ptr_BlockValidationState_ptr_Params_ptr_bool_bool *)
                   in_stack_fffffffffffffd20);
      }
      Params();
      CChainParams::GetConsensus
                ((CChainParams *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      bVar1 = std::
              function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
              ::operator()(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                           (BlockValidationState *)in_stack_fffffffffffffd40,
                           in_stack_fffffffffffffd38,(bool)in_stack_fffffffffffffd5f,
                           (bool)in_stack_fffffffffffffd5e);
      if (bVar1) {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd38,
                     (char *)in_stack_fffffffffffffd30);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd38,
                     (char *)in_stack_fffffffffffffd30);
          base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffd20);
          in_stack_fffffffffffffd30 =
               (function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                *)(in_RDI + 0x18);
          in_stack_fffffffffffffd38 = (Params *)(in_RDI + 0x20);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          in_stack_fffffffffffffd28 = local_108;
          in_stack_fffffffffffffd20 =
               "Successfully reconstructed block %s with %lu txn prefilled, %lu txn from mempool (incl at least %lu from extra pool) and %lu txn requested\n"
          ;
          in_stack_fffffffffffffd18 = 1;
          logging_function._M_str = in_stack_fffffffffffffde8;
          logging_function._M_len = in_stack_fffffffffffffde0;
          source_file._M_str = in_RDI;
          source_file._M_len = sVar3;
          in_stack_fffffffffffffd80 = in_stack_fffffffffffffd38;
          in_stack_fffffffffffffd88 = in_stack_fffffffffffffd30;
          LogPrintFormatInternal<std::__cxx11::string,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                     (LogFlags)in_stack_fffffffffffffd38,in_stack_fffffffffffffec0,
                     (ConstevalFormatString<5U>)fmt.fmt,in_stack_fffffffffffffed0,
                     (unsigned_long *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        }
        sVar5 = std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        if (sVar5 < 5) {
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_fffffffffffffd20);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffd20);
          while (bVar1 = __gnu_cxx::
                         operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                     *)in_stack_fffffffffffffd28,
                                    (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                     *)in_stack_fffffffffffffd20), ((bVar1 ^ 0xffU) & 1) != 0) {
            psVar6 = __gnu_cxx::
                     __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                     ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18
                                                ),Trace);
            if (bVar1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
              pcVar4 = "Reconstructed block %s required tx %s\n";
              base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffd20);
              std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
              CTransaction::GetHash
                        ((CTransaction *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
              transaction_identifier<false>::ToString_abi_cxx11_
                        ((transaction_identifier<false> *)in_stack_fffffffffffffd20);
              in_stack_fffffffffffffd20 = pcVar4;
              in_stack_fffffffffffffd30 =
                   (function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                    *)&stack0xfffffffffffffeb8;
              in_stack_fffffffffffffd28 = (CBlock *)&stack0xfffffffffffffed8;
              in_stack_fffffffffffffd18 = 1;
              logging_function_00._M_str = (char *)psVar6;
              logging_function_00._M_len = (size_t)in_stack_fffffffffffffd20;
              source_file_00._M_str = in_RDI;
              source_file_00._M_len = sVar3;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_00,source_file_00,
                         (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                         (LogFlags)in_stack_fffffffffffffd80,in_stack_fffffffffffffec0,fmt,
                         in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            }
            __gnu_cxx::
            __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
            ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          }
        }
        local_1c4 = READ_STATUS_OK;
      }
      else {
        BVar2 = ValidationState<BlockValidationResult>::GetResult
                          ((ValidationState<BlockValidationResult> *)
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        if (BVar2 == BLOCK_MUTATED) {
          local_1c4 = READ_STATUS_FAILED;
        }
        else {
          local_1c4 = READ_STATUS_CHECKBLOCK_FAILED;
        }
      }
      std::
      function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
      ::~function((function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                   *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      BlockValidationState::~BlockValidationState
                ((BlockValidationState *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    }
    else {
      local_1c4 = READ_STATUS_INVALID;
    }
  }
LAB_008b9822:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return local_1c4;
}

Assistant:

ReadStatus PartiallyDownloadedBlock::FillBlock(CBlock& block, const std::vector<CTransactionRef>& vtx_missing)
{
    if (header.IsNull()) return READ_STATUS_INVALID;

    uint256 hash = header.GetHash();
    block = header;
    block.vtx.resize(txn_available.size());

    size_t tx_missing_offset = 0;
    for (size_t i = 0; i < txn_available.size(); i++) {
        if (!txn_available[i]) {
            if (vtx_missing.size() <= tx_missing_offset)
                return READ_STATUS_INVALID;
            block.vtx[i] = vtx_missing[tx_missing_offset++];
        } else
            block.vtx[i] = std::move(txn_available[i]);
    }

    // Make sure we can't call FillBlock again.
    header.SetNull();
    txn_available.clear();

    if (vtx_missing.size() != tx_missing_offset)
        return READ_STATUS_INVALID;

    BlockValidationState state;
    CheckBlockFn check_block = m_check_block_mock ? m_check_block_mock : CheckBlock;
    if (!check_block(block, state, Params().GetConsensus(), /*fCheckPoW=*/true, /*fCheckMerkleRoot=*/true)) {
        // TODO: We really want to just check merkle tree manually here,
        // but that is expensive, and CheckBlock caches a block's
        // "checked-status" (in the CBlock?). CBlock should be able to
        // check its own merkle root and cache that check.
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED)
            return READ_STATUS_FAILED; // Possible Short ID collision
        return READ_STATUS_CHECKBLOCK_FAILED;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Successfully reconstructed block %s with %lu txn prefilled, %lu txn from mempool (incl at least %lu from extra pool) and %lu txn requested\n", hash.ToString(), prefilled_count, mempool_count, extra_count, vtx_missing.size());
    if (vtx_missing.size() < 5) {
        for (const auto& tx : vtx_missing) {
            LogDebug(BCLog::CMPCTBLOCK, "Reconstructed block %s required tx %s\n", hash.ToString(), tx->GetHash().ToString());
        }
    }

    return READ_STATUS_OK;
}